

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [24];
  long *in_RSI;
  long *in_RDI;
  float fVar30;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar31 [32];
  float fVar39;
  undefined1 auVar32 [32];
  __m128 _p_1;
  __m128 _alpha128;
  __m256 _p;
  __m256 _alpha256;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m256 neg;
  __m256 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  int local_1618;
  undefined8 local_1608;
  undefined8 local_1600;
  undefined8 local_15f8;
  undefined4 local_15f0;
  long local_15e8;
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined8 local_15c8;
  undefined1 (*local_15c0) [32];
  int local_15b8;
  int local_15b4;
  int local_15b0;
  int local_15ac;
  int local_15a8;
  int local_15a4;
  long *local_1598;
  undefined1 local_1585;
  int local_1584;
  undefined8 *local_1578;
  undefined8 *local_1570;
  undefined8 *local_1560;
  uint local_154c;
  undefined1 (*local_1548) [32];
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  float fStack_1524;
  undefined1 (*local_1508) [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined4 local_1474;
  float local_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  float local_145c;
  undefined1 (*local_1458) [32];
  float local_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined1 (*local_1438) [32];
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined4 local_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined4 local_13d4;
  long local_13d0;
  undefined4 local_13c4;
  long local_13c0;
  undefined1 (*local_13b8) [32];
  undefined4 local_13ac;
  int local_13a8;
  int local_13a4;
  undefined8 *local_13a0;
  undefined4 local_1394;
  long local_1390;
  undefined8 *local_1370;
  undefined1 local_1340 [32];
  undefined4 local_1320;
  undefined4 local_131c;
  undefined4 local_1318;
  undefined4 local_1314;
  undefined4 local_1310;
  undefined4 local_130c;
  undefined4 local_1308;
  undefined4 local_1304;
  undefined1 local_1300 [32];
  uint local_12e0;
  uint local_12dc;
  uint local_12d8;
  uint local_12d4;
  uint local_12d0;
  uint local_12cc;
  uint local_12c8;
  uint local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  ulong uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  ulong uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [8];
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [32];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined1 local_f80 [8];
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 *local_e98;
  undefined8 *local_e90;
  undefined8 *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60;
  float fStack_e5c;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float *local_df8;
  undefined1 *local_df0;
  undefined8 *local_de8;
  float local_de0 [2];
  float afStack_dd8 [2];
  float afStack_dd0 [2];
  float afStack_dc8 [2];
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float *local_d58;
  undefined1 *local_d50;
  undefined8 *local_d48;
  float local_d40 [2];
  float afStack_d38 [2];
  float afStack_d30 [2];
  float afStack_d28 [2];
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float *local_cb8;
  undefined1 *local_cb0;
  undefined8 *local_ca8;
  float local_ca0 [2];
  float afStack_c98 [2];
  float afStack_c90 [2];
  float afStack_c88 [2];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float *local_c18;
  undefined1 *local_c10;
  undefined8 *local_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float *local_b78;
  undefined1 *local_b70;
  undefined8 *local_b68;
  float local_b60 [2];
  float afStack_b58 [2];
  float afStack_b50 [2];
  float afStack_b48 [2];
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float *local_ad8;
  float *local_ad0;
  undefined1 *local_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined4 uStack_a84;
  float local_a80 [2];
  float afStack_a78 [2];
  float afStack_a70 [2];
  float afStack_a68 [2];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 *local_9f8;
  float *local_9f0;
  undefined1 *local_9e8;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float local_9a0 [2];
  float afStack_998 [2];
  float afStack_990 [2];
  float afStack_988 [2];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 *local_958;
  float *local_950;
  undefined1 *local_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined4 local_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  ulong uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  ulong uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined4 local_514;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_338;
  float *local_330;
  undefined1 *local_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2d8;
  float *local_2d0;
  undefined1 *local_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  float *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  float local_200 [2];
  float afStack_1f8 [2];
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float *local_1b8;
  undefined1 *local_1b0;
  undefined8 *local_1a8;
  float local_1a0 [2];
  float afStack_198 [2];
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  float *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  float local_140 [2];
  float afStack_138 [2];
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  float *local_f8;
  undefined1 *local_f0;
  undefined8 *local_e8;
  float local_e0 [2];
  float afStack_d8 [2];
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  float *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  float local_80 [2];
  float afStack_78 [2];
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_15a4 = *(int *)((long)in_RSI + 0x2c);
  local_15a8 = (int)in_RSI[6];
  local_15ac = (int)in_RSI[7];
  local_15b0 = (int)in_RSI[3];
  local_15b4 = local_15a4 * local_15a8 * local_15b0;
  local_1598 = in_RSI;
  for (local_15b8 = 0; local_15b8 < local_15ac; local_15b8 = local_15b8 + 1) {
    local_1578 = &local_1608;
    local_13a4 = *(int *)((long)local_1598 + 0x2c);
    local_13a8 = (int)local_1598[6];
    local_13ac = *(undefined4 *)((long)local_1598 + 0x34);
    local_13b8 = (undefined1 (*) [32])
                 (*local_1598 + local_1598[8] * (long)local_15b8 * local_1598[2]);
    local_13c0 = local_1598[2];
    local_13c4 = (undefined4)local_1598[3];
    local_13d0 = local_1598[4];
    local_13a0 = &local_1608;
    local_1390 = (long)local_13a4 * (long)local_13a8 * local_13c0;
    local_1570 = &local_1608;
    local_1560 = &local_1608;
    local_1394 = 0x10;
    local_1584 = local_15b8;
    local_1585 = 1;
    local_1608 = 0;
    local_15f8 = 0;
    local_15f0 = 0;
    local_15e0 = 0;
    local_15dc = 0;
    local_15d8 = 0;
    local_15d4 = 0;
    local_15d0 = 0;
    local_15c8 = 0;
    local_1600 = 0;
    local_1618 = 0;
    local_154c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_154c),ZEXT416(local_154c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_154c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_154c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_154c),ZEXT416(local_154c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_154c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_154c),0x30);
    auVar31._16_16_ = auVar1;
    auVar31._0_16_ = auVar2;
    local_1300._0_8_ = auVar2._0_8_;
    local_1300._8_8_ = auVar2._8_8_;
    local_1300._16_8_ = auVar1._0_8_;
    local_1300._24_8_ = auVar1._8_8_;
    local_15c0 = local_13b8;
    for (; local_1618 + 7 < local_15b4; local_1618 = local_1618 + 8) {
      local_1548 = local_15c0;
      local_14a0 = *(undefined8 *)*local_15c0;
      uStack_1498 = *(undefined8 *)(*local_15c0 + 8);
      uStack_1490 = *(undefined8 *)(*local_15c0 + 0x10);
      uStack_1488 = *(undefined8 *)(*local_15c0 + 0x18);
      local_1508 = local_15c0;
      local_14c0 = local_1300._0_8_;
      uStack_14b8 = local_1300._8_8_;
      uStack_14b0 = local_1300._16_8_;
      uStack_14a8 = local_1300._24_8_;
      local_1280 = ZEXT832(0) << 0x20;
      local_12a0 = 0;
      local_1260._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1298 = local_1260._8_8_;
      uStack_1290 = 0;
      uStack_1288 = 0;
      local_14e0 = vmaxps_avx(ZEXT832((ulong)local_1260._8_8_) << 0x40,*local_15c0);
      local_1220 = 0;
      uStack_1218 = local_1260._8_8_;
      uStack_1210 = 0;
      uStack_1208 = 0;
      auVar6 = vminps_avx(ZEXT832((ulong)local_1260._8_8_) << 0x40,*local_15c0);
      local_1500._0_8_ = auVar6._0_8_;
      local_1500._8_8_ = auVar6._8_8_;
      local_1500._16_8_ = auVar6._16_8_;
      local_1500._24_8_ = auVar6._24_8_;
      local_1080 = ZEXT832(0) << 0x20;
      local_1160 = 0x3f8000003f800000;
      uStack_1158 = 0x3f8000003f800000;
      uStack_1150 = 0x3f8000003f800000;
      uStack_1148 = 0x3f8000003f800000;
      local_1040 = local_1500._0_8_;
      uStack_1038 = local_1500._8_8_;
      uStack_1030 = local_1500._16_8_;
      uStack_1028 = local_1500._24_8_;
      local_1060 = 0x42b0c0a542b0c0a5;
      uStack_1058 = 0x42b0c0a542b0c0a5;
      uStack_1050 = 0x42b0c0a542b0c0a5;
      uStack_1048 = 0x42b0c0a542b0c0a5;
      auVar12._8_8_ = 0x42b0c0a542b0c0a5;
      auVar12._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12._16_8_ = 0x42b0c0a542b0c0a5;
      auVar12._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar12);
      local_10e0._0_8_ = auVar6._0_8_;
      local_10a0 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar6._8_8_;
      uStack_1098 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar6._16_8_;
      uStack_1090 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar6._24_8_;
      uStack_1088 = local_10e0._24_8_;
      local_10c0 = 0xc2b0c0a5c2b0c0a5;
      uStack_10b8 = 0xc2b0c0a5c2b0c0a5;
      uStack_10b0 = 0xc2b0c0a5c2b0c0a5;
      uStack_10a8 = 0xc2b0c0a5c2b0c0a5;
      auVar7._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar6,auVar7);
      local_e98 = local_10e0;
      local_ad0 = ::_ps256_cephes_LOG2EF;
      local_ad8 = ::_ps256_0p5;
      local_10e0._0_8_ = auVar5._0_8_;
      uVar8 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar5._8_8_;
      uVar9 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar5._16_8_;
      uVar10 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar5._24_8_;
      uVar11 = local_10e0._24_8_;
      local_a80[0] = 1.442695;
      local_a80[1] = 1.442695;
      afStack_a78[0] = 1.442695;
      afStack_a78[1] = 1.442695;
      afStack_a70[0] = 1.442695;
      afStack_a70[1] = 1.442695;
      afStack_a68[0] = 1.442695;
      afStack_a68[1] = 1.442695;
      local_a60._0_4_ = auVar5._0_4_;
      local_a60._4_4_ = auVar5._4_4_;
      uStack_a58._0_4_ = auVar5._8_4_;
      uStack_a58._4_4_ = auVar5._12_4_;
      uStack_a50._0_4_ = auVar5._16_4_;
      uStack_a50._4_4_ = auVar5._20_4_;
      uStack_a48._0_4_ = auVar5._24_4_;
      uStack_a84 = 0x3fb8aa3b;
      local_aa0 = (float)local_a60 * 1.442695;
      fStack_a9c = local_a60._4_4_ * 1.442695;
      fStack_a98 = (float)uStack_a58 * 1.442695;
      fStack_a94 = uStack_a58._4_4_ * 1.442695;
      fStack_a90 = (float)uStack_a50 * 1.442695;
      fStack_a8c = uStack_a50._4_4_ * 1.442695;
      fStack_a88 = (float)uStack_a48 * 1.442695;
      local_ac0[0] = 0.5;
      local_ac0[1] = 0.5;
      afStack_ab8[0] = 0.5;
      afStack_ab8[1] = 0.5;
      afStack_ab0[0] = 0.5;
      afStack_ab0[1] = 0.5;
      afStack_aa8[0] = 0.5;
      afStack_aa8[1] = 0.5;
      local_1120._4_4_ = fStack_a9c + 0.5;
      local_1120._0_4_ = local_aa0 + 0.5;
      uStack_1118._0_4_ = fStack_a98 + 0.5;
      uStack_1118._4_4_ = fStack_a94 + 0.5;
      uStack_1110._0_4_ = fStack_a90 + 0.5;
      uStack_1110._4_4_ = fStack_a8c + 0.5;
      uStack_1108._0_4_ = fStack_a88 + 0.5;
      uStack_1108._4_4_ = 0x3ff8aa3b;
      auVar7 = vroundps_avx(_local_1120,1);
      auVar6 = vcmpps_avx(_local_1120,auVar7,1);
      local_1180._0_8_ = auVar6._0_8_;
      local_a20 = local_1180._0_8_;
      local_1180._8_8_ = auVar6._8_8_;
      uStack_a18 = local_1180._8_8_;
      local_1180._16_8_ = auVar6._16_8_;
      uStack_a10 = local_1180._16_8_;
      local_1180._24_8_ = auVar6._24_8_;
      uStack_a08 = local_1180._24_8_;
      local_a40 = 0x3f8000003f800000;
      uStack_a38 = 0x3f8000003f800000;
      uStack_a30 = 0x3f8000003f800000;
      uStack_a28 = 0x3f8000003f800000;
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._16_8_ = 0x3f8000003f800000;
      auVar13._24_8_ = 0x3f8000003f800000;
      local_1180 = vandps_avx(auVar6,auVar13);
      local_1100 = auVar7._0_8_;
      local_1000 = local_1100;
      uStack_10f8 = auVar7._8_8_;
      uStack_ff8 = uStack_10f8;
      uStack_10f0 = auVar7._16_8_;
      uStack_ff0 = uStack_10f0;
      uStack_10e8 = auVar7._24_8_;
      uStack_fe8 = uStack_10e8;
      local_1020 = local_1180._0_8_;
      uStack_1018 = local_1180._8_8_;
      uStack_1010 = local_1180._16_8_;
      uStack_1008 = local_1180._24_8_;
      _local_1120 = vsubps_avx(auVar7,local_1180);
      local_9e8 = local_1120;
      local_950 = ::_ps256_cephes_exp_C1;
      local_920 = local_10e0._0_8_;
      uStack_918 = local_10e0._8_8_;
      uStack_910 = local_10e0._16_8_;
      uStack_908 = local_10e0._24_8_;
      local_900[0] = 0.6933594;
      local_900[1] = 0.6933594;
      afStack_8f8[0] = 0.6933594;
      afStack_8f8[1] = 0.6933594;
      afStack_8f0[0] = 0.6933594;
      afStack_8f0[1] = 0.6933594;
      afStack_8e8[0] = 0.6933594;
      afStack_8e8[1] = 0.6933594;
      local_8e0._0_4_ = local_1120._0_4_;
      local_8e0._4_4_ = local_1120._4_4_;
      uStack_8d8._0_4_ = local_1120._8_4_;
      uStack_8d8._4_4_ = local_1120._12_4_;
      uStack_8d0._0_4_ = local_1120._16_4_;
      uStack_8d0._4_4_ = local_1120._20_4_;
      uStack_8c8._0_4_ = local_1120._24_4_;
      uStack_8c8._4_4_ = local_1120._28_4_;
      fStack_924 = uStack_8c8._4_4_;
      local_940 = (float)local_8e0 * 0.6933594;
      fStack_93c = local_8e0._4_4_ * 0.6933594;
      fStack_938 = (float)uStack_8d8 * 0.6933594;
      fStack_934 = uStack_8d8._4_4_ * 0.6933594;
      fStack_930 = (float)uStack_8d0 * 0.6933594;
      fStack_92c = uStack_8d0._4_4_ * 0.6933594;
      fStack_928 = (float)uStack_8c8 * 0.6933594;
      auVar15._4_4_ = fStack_93c;
      auVar15._0_4_ = local_940;
      auVar15._8_4_ = fStack_938;
      auVar15._12_4_ = fStack_934;
      auVar15._16_4_ = fStack_930;
      auVar15._20_4_ = fStack_92c;
      auVar15._24_4_ = fStack_928;
      auVar15._28_4_ = uStack_8c8._4_4_;
      auVar6 = vsubps_avx(auVar5,auVar15);
      local_9f0 = ::_ps256_cephes_exp_C2;
      local_10e0._0_8_ = auVar6._0_8_;
      local_9c0 = local_10e0._0_8_;
      local_10e0._8_8_ = auVar6._8_8_;
      uStack_9b8 = local_10e0._8_8_;
      local_10e0._16_8_ = auVar6._16_8_;
      uStack_9b0 = local_10e0._16_8_;
      local_10e0._24_8_ = auVar6._24_8_;
      uStack_9a8 = local_10e0._24_8_;
      local_980 = local_1120;
      uStack_978 = uStack_1118;
      uStack_970 = uStack_1110;
      uStack_968 = uStack_1108;
      local_9a0[0] = -0.00021219444;
      local_9a0[1] = -0.00021219444;
      afStack_998[0] = -0.00021219444;
      afStack_998[1] = -0.00021219444;
      afStack_990[0] = -0.00021219444;
      afStack_990[1] = -0.00021219444;
      afStack_988[0] = -0.00021219444;
      afStack_988[1] = -0.00021219444;
      fStack_9c4 = uStack_8c8._4_4_;
      local_9e0 = (float)local_8e0 * -0.00021219444;
      fStack_9dc = local_8e0._4_4_ * -0.00021219444;
      fStack_9d8 = (float)uStack_8d8 * -0.00021219444;
      fStack_9d4 = uStack_8d8._4_4_ * -0.00021219444;
      fStack_9d0 = (float)uStack_8d0 * -0.00021219444;
      fStack_9cc = uStack_8d0._4_4_ * -0.00021219444;
      fStack_9c8 = (float)uStack_8c8 * -0.00021219444;
      auVar14._4_4_ = fStack_9dc;
      auVar14._0_4_ = local_9e0;
      auVar14._8_4_ = fStack_9d8;
      auVar14._12_4_ = fStack_9d4;
      auVar14._16_4_ = fStack_9d0;
      auVar14._20_4_ = fStack_9cc;
      auVar14._24_4_ = fStack_9c8;
      auVar14._28_4_ = uStack_8c8._4_4_;
      local_10e0 = vsubps_avx(auVar6,auVar14);
      local_f20 = local_10e0._0_8_;
      uStack_f18 = local_10e0._8_8_;
      uStack_f10 = local_10e0._16_8_;
      uStack_f08 = local_10e0._24_8_;
      local_f00._0_4_ = local_10e0._0_4_;
      local_f00._4_4_ = local_10e0._4_4_;
      uStack_ef8._0_4_ = local_10e0._8_4_;
      uStack_ef8._4_4_ = local_10e0._12_4_;
      uStack_ef0._0_4_ = local_10e0._16_4_;
      uStack_ef0._4_4_ = local_10e0._20_4_;
      uStack_ee8._0_4_ = local_10e0._24_4_;
      uStack_ee8._4_4_ = local_10e0._28_4_;
      local_1100 = CONCAT44(local_f00._4_4_ * local_f00._4_4_,(float)local_f00 * (float)local_f00);
      uStack_10f8._0_4_ = (float)uStack_ef8 * (float)uStack_ef8;
      uStack_10f8._4_4_ = uStack_ef8._4_4_ * uStack_ef8._4_4_;
      uStack_10f0._0_4_ = (float)uStack_ef0 * (float)uStack_ef0;
      uStack_10f0._4_4_ = uStack_ef0._4_4_ * uStack_ef0._4_4_;
      auVar29 = _local_1100;
      uStack_10e8._0_4_ = (float)uStack_ee8 * (float)uStack_ee8;
      uStack_10e8._4_4_ = uStack_ee8._4_4_;
      auVar7 = _local_1100;
      local_e88 = &local_11a0;
      local_b78 = ::_ps256_cephes_exp_p1;
      local_b00 = 0x3950696739506967;
      uStack_af8 = 0x3950696739506967;
      uStack_af0 = 0x3950696739506967;
      uStack_ae8 = 0x3950696739506967;
      local_b20 = local_10e0._0_8_;
      uStack_b18 = local_10e0._8_8_;
      uStack_b10 = local_10e0._16_8_;
      uStack_b08 = local_10e0._24_8_;
      fStack_b24 = uStack_ee8._4_4_;
      local_b40 = (float)local_f00 * 0.00019875691;
      fStack_b3c = local_f00._4_4_ * 0.00019875691;
      fStack_b38 = (float)uStack_ef8 * 0.00019875691;
      fStack_b34 = uStack_ef8._4_4_ * 0.00019875691;
      fStack_b30 = (float)uStack_ef0 * 0.00019875691;
      fStack_b2c = uStack_ef0._4_4_ * 0.00019875691;
      fStack_b28 = (float)uStack_ee8 * 0.00019875691;
      local_b60[0] = 0.0013981999;
      local_b60[1] = 0.0013981999;
      afStack_b58[0] = 0.0013981999;
      afStack_b58[1] = 0.0013981999;
      afStack_b50[0] = 0.0013981999;
      afStack_b50[1] = 0.0013981999;
      afStack_b48[0] = 0.0013981999;
      afStack_b48[1] = 0.0013981999;
      local_11a0 = CONCAT44(fStack_b3c + 0.0013981999,local_b40 + 0.0013981999);
      uStack_1198 = CONCAT44(fStack_b34 + 0.0013981999,fStack_b38 + 0.0013981999);
      uStack_1190 = CONCAT44(fStack_b2c + 0.0013981999,fStack_b30 + 0.0013981999);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + 0.0013981999,fStack_b28 + 0.0013981999);
      local_c18 = ::_ps256_cephes_exp_p2;
      local_ba0 = local_11a0;
      uStack_b98 = uStack_1198;
      uStack_b90 = uStack_1190;
      uStack_b88 = uStack_1188;
      local_bc0 = local_10e0._0_8_;
      uStack_bb8 = local_10e0._8_8_;
      uStack_bb0 = local_10e0._16_8_;
      uStack_ba8 = local_10e0._24_8_;
      fStack_bc4 = uStack_ee8._4_4_;
      local_be0 = (local_b40 + 0.0013981999) * (float)local_f00;
      fStack_bdc = (fStack_b3c + 0.0013981999) * local_f00._4_4_;
      fStack_bd8 = (fStack_b38 + 0.0013981999) * (float)uStack_ef8;
      fStack_bd4 = (fStack_b34 + 0.0013981999) * uStack_ef8._4_4_;
      fStack_bd0 = (fStack_b30 + 0.0013981999) * (float)uStack_ef0;
      fStack_bcc = (fStack_b2c + 0.0013981999) * uStack_ef0._4_4_;
      fStack_bc8 = (fStack_b28 + 0.0013981999) * (float)uStack_ee8;
      local_c00[0] = 0.008333452;
      local_c00[1] = 0.008333452;
      afStack_bf8[0] = 0.008333452;
      afStack_bf8[1] = 0.008333452;
      afStack_bf0[0] = 0.008333452;
      afStack_bf0[1] = 0.008333452;
      afStack_be8[0] = 0.008333452;
      afStack_be8[1] = 0.008333452;
      local_11a0 = CONCAT44(fStack_bdc + 0.008333452,local_be0 + 0.008333452);
      uStack_1198 = CONCAT44(fStack_bd4 + 0.008333452,fStack_bd8 + 0.008333452);
      uStack_1190 = CONCAT44(fStack_bcc + 0.008333452,fStack_bd0 + 0.008333452);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + 0.008333452,fStack_bc8 + 0.008333452);
      local_cb8 = ::_ps256_cephes_exp_p3;
      local_c40 = local_11a0;
      uStack_c38 = uStack_1198;
      uStack_c30 = uStack_1190;
      uStack_c28 = uStack_1188;
      local_c60 = local_10e0._0_8_;
      uStack_c58 = local_10e0._8_8_;
      uStack_c50 = local_10e0._16_8_;
      uStack_c48 = local_10e0._24_8_;
      fStack_c64 = uStack_ee8._4_4_;
      local_c80 = (local_be0 + 0.008333452) * (float)local_f00;
      fStack_c7c = (fStack_bdc + 0.008333452) * local_f00._4_4_;
      fStack_c78 = (fStack_bd8 + 0.008333452) * (float)uStack_ef8;
      fStack_c74 = (fStack_bd4 + 0.008333452) * uStack_ef8._4_4_;
      fStack_c70 = (fStack_bd0 + 0.008333452) * (float)uStack_ef0;
      fStack_c6c = (fStack_bcc + 0.008333452) * uStack_ef0._4_4_;
      fStack_c68 = (fStack_bc8 + 0.008333452) * (float)uStack_ee8;
      local_ca0[0] = 0.041665796;
      local_ca0[1] = 0.041665796;
      afStack_c98[0] = 0.041665796;
      afStack_c98[1] = 0.041665796;
      afStack_c90[0] = 0.041665796;
      afStack_c90[1] = 0.041665796;
      afStack_c88[0] = 0.041665796;
      afStack_c88[1] = 0.041665796;
      local_11a0 = CONCAT44(fStack_c7c + 0.041665796,local_c80 + 0.041665796);
      uStack_1198 = CONCAT44(fStack_c74 + 0.041665796,fStack_c78 + 0.041665796);
      uStack_1190 = CONCAT44(fStack_c6c + 0.041665796,fStack_c70 + 0.041665796);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + 0.041665796,fStack_c68 + 0.041665796);
      local_d58 = ::_ps256_cephes_exp_p4;
      local_ce0 = local_11a0;
      uStack_cd8 = uStack_1198;
      uStack_cd0 = uStack_1190;
      uStack_cc8 = uStack_1188;
      local_d00 = local_10e0._0_8_;
      uStack_cf8 = local_10e0._8_8_;
      uStack_cf0 = local_10e0._16_8_;
      uStack_ce8 = local_10e0._24_8_;
      fStack_d04 = uStack_ee8._4_4_;
      local_d20 = (local_c80 + 0.041665796) * (float)local_f00;
      fStack_d1c = (fStack_c7c + 0.041665796) * local_f00._4_4_;
      fStack_d18 = (fStack_c78 + 0.041665796) * (float)uStack_ef8;
      fStack_d14 = (fStack_c74 + 0.041665796) * uStack_ef8._4_4_;
      fStack_d10 = (fStack_c70 + 0.041665796) * (float)uStack_ef0;
      fStack_d0c = (fStack_c6c + 0.041665796) * uStack_ef0._4_4_;
      fStack_d08 = (fStack_c68 + 0.041665796) * (float)uStack_ee8;
      local_d40[0] = 0.16666666;
      local_d40[1] = 0.16666666;
      afStack_d38[0] = 0.16666666;
      afStack_d38[1] = 0.16666666;
      afStack_d30[0] = 0.16666666;
      afStack_d30[1] = 0.16666666;
      afStack_d28[0] = 0.16666666;
      afStack_d28[1] = 0.16666666;
      local_11a0 = CONCAT44(fStack_d1c + 0.16666666,local_d20 + 0.16666666);
      uStack_1198 = CONCAT44(fStack_d14 + 0.16666666,fStack_d18 + 0.16666666);
      uStack_1190 = CONCAT44(fStack_d0c + 0.16666666,fStack_d10 + 0.16666666);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + 0.16666666,fStack_d08 + 0.16666666);
      local_df8 = ::_ps256_cephes_exp_p5;
      local_d80 = local_11a0;
      uStack_d78 = uStack_1198;
      uStack_d70 = uStack_1190;
      uStack_d68 = uStack_1188;
      local_da0 = local_10e0._0_8_;
      uStack_d98 = local_10e0._8_8_;
      uStack_d90 = local_10e0._16_8_;
      uStack_d88 = local_10e0._24_8_;
      fStack_da4 = uStack_ee8._4_4_;
      local_dc0 = (local_d20 + 0.16666666) * (float)local_f00;
      fStack_dbc = (fStack_d1c + 0.16666666) * local_f00._4_4_;
      fStack_db8 = (fStack_d18 + 0.16666666) * (float)uStack_ef8;
      fStack_db4 = (fStack_d14 + 0.16666666) * uStack_ef8._4_4_;
      fStack_db0 = (fStack_d10 + 0.16666666) * (float)uStack_ef0;
      fStack_dac = (fStack_d0c + 0.16666666) * uStack_ef0._4_4_;
      fStack_da8 = (fStack_d08 + 0.16666666) * (float)uStack_ee8;
      local_de0[0] = 0.5;
      local_de0[1] = 0.5;
      afStack_dd8[0] = 0.5;
      afStack_dd8[1] = 0.5;
      afStack_dd0[0] = 0.5;
      afStack_dd0[1] = 0.5;
      afStack_dc8[0] = 0.5;
      afStack_dc8[1] = 0.5;
      local_11a0 = CONCAT44(fStack_dbc + 0.5,local_dc0 + 0.5);
      uStack_1198 = CONCAT44(fStack_db4 + 0.5,fStack_db8 + 0.5);
      uStack_1190 = CONCAT44(fStack_dac + 0.5,fStack_db0 + 0.5);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + 0.5,fStack_da8 + 0.5);
      local_e90 = &local_1100;
      local_e20 = local_11a0;
      uStack_e18 = uStack_1198;
      uStack_e10 = uStack_1190;
      uStack_e08 = uStack_1188;
      local_e40 = local_1100;
      uStack_e38 = uStack_10f8;
      uStack_10f0 = auVar29._16_8_;
      uStack_e30 = uStack_10f0;
      uStack_10e8 = auVar7._24_8_;
      uStack_e28 = uStack_10e8;
      fStack_e44 = uStack_ee8._4_4_;
      local_e60 = (local_dc0 + 0.5) * (float)local_f00 * (float)local_f00;
      fStack_e5c = (fStack_dbc + 0.5) * local_f00._4_4_ * local_f00._4_4_;
      fStack_e58 = (fStack_db8 + 0.5) * (float)uStack_ef8 * (float)uStack_ef8;
      fStack_e54 = (fStack_db4 + 0.5) * uStack_ef8._4_4_ * uStack_ef8._4_4_;
      fStack_e50 = (fStack_db0 + 0.5) * (float)uStack_ef0 * (float)uStack_ef0;
      fStack_e4c = (fStack_dac + 0.5) * uStack_ef0._4_4_ * uStack_ef0._4_4_;
      fStack_e48 = (fStack_da8 + 0.5) * (float)uStack_ee8 * (float)uStack_ee8;
      local_e80 = local_10e0._0_8_;
      uStack_e78 = local_10e0._8_8_;
      uStack_e70 = local_10e0._16_8_;
      uStack_e68 = local_10e0._24_8_;
      local_11a0 = CONCAT44(fStack_e5c + local_f00._4_4_,local_e60 + (float)local_f00);
      uStack_1198 = CONCAT44(fStack_e54 + uStack_ef8._4_4_,fStack_e58 + (float)uStack_ef8);
      uStack_1190 = CONCAT44(fStack_e4c + uStack_ef0._4_4_,fStack_e50 + (float)uStack_ef0);
      uStack_1188 = CONCAT44(uStack_ee8._4_4_ + uStack_ee8._4_4_,fStack_e48 + (float)uStack_ee8);
      local_fc0 = local_11a0;
      uStack_fb8 = uStack_1198;
      uStack_fb0 = uStack_1190;
      uStack_fa8 = uStack_1188;
      local_fe0 = 0x3f8000003f800000;
      uStack_fd8 = 0x3f8000003f800000;
      uStack_fd0 = 0x3f8000003f800000;
      uStack_fc8 = 0x3f8000003f800000;
      fVar30 = local_e60 + (float)local_f00 + 1.0;
      fVar33 = fStack_e5c + local_f00._4_4_ + 1.0;
      fVar34 = fStack_e58 + (float)uStack_ef8 + 1.0;
      fVar35 = fStack_e54 + uStack_ef8._4_4_ + 1.0;
      fVar36 = fStack_e50 + (float)uStack_ef0 + 1.0;
      fVar37 = fStack_e4c + uStack_ef0._4_4_ + 1.0;
      fVar38 = fStack_e48 + (float)uStack_ee8 + 1.0;
      fVar39 = uStack_ee8._4_4_ + uStack_ee8._4_4_ + 1.0;
      local_11a0 = CONCAT44(fVar33,fVar30);
      uStack_1198 = CONCAT44(fVar35,fVar34);
      uStack_1190 = CONCAT44(fVar37,fVar36);
      uStack_1188 = CONCAT44(fVar39,fVar38);
      local_8c0 = local_1120;
      uStack_8b8 = uStack_1118;
      uStack_8b0 = uStack_1110;
      uStack_8a8 = uStack_1108;
      local_1140 = CONCAT44((int)local_8e0._4_4_,(int)(float)local_8e0);
      uStack_1138 = CONCAT44((int)uStack_8d8._4_4_,(int)(float)uStack_8d8);
      uStack_1130 = CONCAT44((int)uStack_8d0._4_4_,(int)(float)uStack_8d0);
      uStack_1128 = CONCAT44((int)uStack_8c8._4_4_,(int)(float)uStack_8c8);
      local_7c0 = local_1140;
      uStack_7b8 = uStack_1138;
      uStack_7b0 = uStack_1130;
      uStack_7a8 = uStack_1128;
      local_7e0 = 0x7f0000007f;
      uStack_7d8 = 0x7f0000007f;
      uStack_7d0 = 0x7f0000007f;
      uStack_7c8 = 0x7f0000007f;
      local_860 = local_1140;
      uStack_858 = uStack_1138;
      uStack_850 = uStack_1130;
      uStack_848 = uStack_1128;
      local_880 = 0x7f0000007f;
      uStack_878 = 0x7f0000007f;
      uStack_870 = 0x7f0000007f;
      uStack_868 = 0x7f0000007f;
      local_810 = 0x7f0000007f;
      uStack_808 = 0x7f0000007f;
      local_820 = 0x7f0000007f;
      uStack_818 = 0x7f0000007f;
      local_690 = local_1140;
      uStack_688 = uStack_1138;
      local_6a0 = 0x7f0000007f;
      uStack_698 = 0x7f0000007f;
      auVar17._8_8_ = uStack_1138;
      auVar17._0_8_ = local_1140;
      auVar16._8_8_ = 0x7f0000007f;
      auVar16._0_8_ = 0x7f0000007f;
      local_7f0 = vpaddd_avx(auVar17,auVar16);
      local_6b0 = uStack_1130;
      uStack_6a8 = uStack_1128;
      local_6c0 = 0x7f0000007f;
      uStack_6b8 = 0x7f0000007f;
      auVar4._8_8_ = uStack_1128;
      auVar4._0_8_ = uStack_1130;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_800 = vpaddd_avx(auVar4,auVar3);
      local_8a0 = local_7f0._0_8_;
      uStack_898 = local_7f0._8_8_;
      uStack_890 = local_800._0_8_;
      uStack_888 = local_800._8_8_;
      local_840 = local_7f0._0_8_;
      uStack_838 = local_7f0._8_8_;
      uStack_830 = local_800._0_8_;
      uStack_828 = local_800._8_8_;
      local_700 = local_7f0._0_8_;
      uStack_6f8 = local_7f0._8_8_;
      uStack_6f0 = local_800._0_8_;
      uStack_6e8 = local_800._8_8_;
      local_704 = 0x17;
      local_780 = local_7f0._0_8_;
      uStack_778 = local_7f0._8_8_;
      uStack_770 = local_800._0_8_;
      uStack_768 = local_800._8_8_;
      local_650 = local_7f0._0_8_;
      uStack_648 = local_7f0._8_8_;
      local_654 = 0x17;
      local_720 = vpslld_avx(local_7f0,ZEXT416(0x17));
      local_670 = local_800._0_8_;
      uStack_668 = local_800._8_8_;
      local_674 = 0x17;
      local_730 = vpslld_avx(local_800,ZEXT416(0x17));
      local_7a0 = local_720._0_8_;
      uStack_798 = local_720._8_8_;
      uStack_790 = local_730._0_8_;
      uStack_788 = local_730._8_8_;
      local_760 = local_720._0_8_;
      uStack_758 = local_720._8_8_;
      uStack_750 = local_730._0_8_;
      uStack_748 = local_730._8_8_;
      local_1140 = local_720._0_8_;
      uStack_1138 = local_720._8_8_;
      uStack_1130 = local_730._0_8_;
      uStack_1128 = local_730._8_8_;
      local_6e0 = local_720._0_8_;
      uStack_6d8 = local_720._8_8_;
      uStack_6d0 = local_730._0_8_;
      uStack_6c8 = local_730._8_8_;
      local_11c0 = local_720._0_8_;
      uStack_11b8 = local_720._8_8_;
      uStack_11b0 = local_730._0_8_;
      uStack_11a8 = local_730._8_8_;
      local_f40 = local_11a0;
      uStack_f38 = uStack_1198;
      uStack_f30 = uStack_1190;
      uStack_f28 = uStack_1188;
      local_f60._0_4_ = local_720._0_4_;
      local_f60._4_4_ = local_720._4_4_;
      uStack_f58._0_4_ = local_720._8_4_;
      uStack_f58._4_4_ = local_720._12_4_;
      uStack_f50._0_4_ = local_730._0_4_;
      uStack_f50._4_4_ = local_730._4_4_;
      uStack_f48._0_4_ = local_730._8_4_;
      local_11a0 = CONCAT44(fVar33 * local_f60._4_4_,fVar30 * (float)local_f60);
      uStack_1198 = CONCAT44(fVar35 * uStack_f58._4_4_,fVar34 * (float)uStack_f58);
      uStack_1190 = CONCAT44(fVar37 * uStack_f50._4_4_,fVar36 * (float)uStack_f50);
      uStack_1188 = CONCAT44(fVar39,fVar38 * (float)uStack_f48);
      local_11e0 = local_11a0;
      uStack_11d8 = uStack_1198;
      uStack_11d0 = uStack_1190;
      uStack_11c8 = uStack_1188;
      local_1474 = 0x3f800000;
      local_1320 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar32._16_16_ = auVar3;
      auVar32._0_16_ = auVar4;
      local_1340._0_8_ = auVar4._0_8_;
      local_1200 = local_1340._0_8_;
      local_1340._8_8_ = auVar4._8_8_;
      uStack_11f8 = local_1340._8_8_;
      local_1340._16_8_ = auVar3._0_8_;
      uStack_11f0 = local_1340._16_8_;
      local_1340._24_8_ = auVar3._8_8_;
      uStack_11e8 = local_1340._24_8_;
      auVar5._8_8_ = uStack_1198;
      auVar5._0_8_ = local_11a0;
      auVar5._16_8_ = uStack_1190;
      auVar5._24_8_ = uStack_1188;
      auVar6._16_8_ = local_1340._16_8_;
      auVar6._0_16_ = auVar4;
      auVar6._24_8_ = local_1340._24_8_;
      local_1500 = vsubps_avx(auVar5,auVar6);
      local_ec0._0_4_ = auVar2._0_4_;
      local_ec0._4_4_ = auVar2._4_4_;
      uStack_eb8._0_4_ = auVar2._8_4_;
      uStack_eb8._4_4_ = auVar2._12_4_;
      uStack_eb0._0_4_ = auVar1._0_4_;
      uStack_eb0._4_4_ = auVar1._4_4_;
      uStack_ea8._0_4_ = auVar1._8_4_;
      uStack_ea8._4_4_ = auVar1._12_4_;
      fStack_f84 = uStack_ea8._4_4_;
      local_ee0._0_4_ = local_1500._0_4_;
      local_ee0._4_4_ = local_1500._4_4_;
      uStack_ed8._0_4_ = local_1500._8_4_;
      uStack_ed8._4_4_ = local_1500._12_4_;
      uStack_ed0._0_4_ = local_1500._16_4_;
      uStack_ed0._4_4_ = local_1500._20_4_;
      uStack_ec8._0_4_ = local_1500._24_4_;
      local_fa0 = (float)local_ec0 * (float)local_ee0;
      fStack_f9c = local_ec0._4_4_ * local_ee0._4_4_;
      fStack_f98 = (float)uStack_eb8 * (float)uStack_ed8;
      fStack_f94 = uStack_eb8._4_4_ * uStack_ed8._4_4_;
      fStack_f90 = (float)uStack_eb0 * (float)uStack_ed0;
      fStack_f8c = uStack_eb0._4_4_ * uStack_ed0._4_4_;
      fStack_f88 = (float)uStack_ea8 * (float)uStack_ec8;
      local_f80._0_4_ = local_14e0._0_4_;
      local_f80._4_4_ = local_14e0._4_4_;
      fStack_f78 = local_14e0._8_4_;
      fStack_f74 = local_14e0._12_4_;
      fStack_f70 = local_14e0._16_4_;
      fStack_f6c = local_14e0._20_4_;
      fStack_f68 = local_14e0._24_4_;
      fStack_f64 = local_14e0._28_4_;
      local_1540 = (float)local_f80._0_4_ + local_fa0;
      fStack_153c = (float)local_f80._4_4_ + fStack_f9c;
      fStack_1538 = fStack_f78 + fStack_f98;
      fStack_1534 = fStack_f74 + fStack_f94;
      fStack_1530 = fStack_f70 + fStack_f90;
      fStack_152c = fStack_f6c + fStack_f8c;
      fStack_1528 = fStack_f68 + fStack_f88;
      fStack_1524 = fStack_f64 + uStack_ea8._4_4_;
      *(ulong *)*local_15c0 = CONCAT44(fStack_153c,local_1540);
      *(ulong *)(*local_15c0 + 8) = CONCAT44(fStack_1534,fStack_1538);
      *(ulong *)(*local_15c0 + 0x10) = CONCAT44(fStack_152c,fStack_1530);
      *(ulong *)(*local_15c0 + 0x18) = CONCAT44(fStack_1524,fStack_1528);
      local_15c0 = local_15c0 + 1;
      local_1340 = auVar32;
      local_131c = local_1320;
      local_1318 = local_1320;
      local_1314 = local_1320;
      local_1310 = local_1320;
      local_130c = local_1320;
      local_1308 = local_1320;
      local_1304 = local_1320;
      local_12c0 = local_14a0;
      uStack_12b8 = uStack_1498;
      uStack_12b0 = uStack_1490;
      uStack_12a8 = uStack_1488;
      local_1260 = local_1280;
      local_1240 = local_14a0;
      uStack_1238 = uStack_1498;
      uStack_1230 = uStack_1490;
      uStack_1228 = uStack_1488;
      _local_1100 = auVar7;
      _local_f80 = local_14e0;
      local_f60 = local_720._0_8_;
      uStack_f58 = local_720._8_8_;
      uStack_f50 = local_730._0_8_;
      uStack_f48 = local_730._8_8_;
      local_f00 = local_f20;
      uStack_ef8 = uStack_f18;
      uStack_ef0 = uStack_f10;
      uStack_ee8 = uStack_f08;
      local_ee0 = local_1500._0_8_;
      uStack_ed8 = local_1500._8_8_;
      uStack_ed0 = local_1500._16_8_;
      uStack_ec8 = local_1500._24_8_;
      local_ec0 = local_1300._0_8_;
      uStack_eb8 = local_1300._8_8_;
      uStack_eb0 = local_1300._16_8_;
      uStack_ea8 = local_1300._24_8_;
      local_df0 = local_e98;
      local_de8 = local_e88;
      local_d50 = local_e98;
      local_d48 = local_e88;
      local_cb0 = local_e98;
      local_ca8 = local_e88;
      local_c10 = local_e98;
      local_c08 = local_e88;
      local_b70 = local_e98;
      local_b68 = local_e88;
      local_ac8 = local_e98;
      local_a60 = uVar8;
      uStack_a58 = uVar9;
      uStack_a50 = uVar10;
      uStack_a48 = uVar11;
      local_9f8 = local_e98;
      local_958 = local_e98;
      local_948 = local_9e8;
      local_8e0 = local_1120;
      uStack_8d8 = uStack_1118;
      uStack_8d0 = uStack_1110;
      uStack_8c8 = uStack_1108;
    }
    local_1470 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    for (; fStack_146c = local_1470, fStack_1468 = local_1470, fStack_1464 = local_1470,
        local_145c = local_1470, local_1370 = local_1560, local_1300 = auVar31,
        local_12e0 = local_154c, local_12dc = local_154c, local_12d8 = local_154c,
        local_12d4 = local_154c, local_12d0 = local_154c, local_12cc = local_154c,
        local_12c8 = local_154c, local_12c4 = local_154c, local_15e8 = local_13d0,
        local_1618 + 3 < local_15b4; local_1618 = local_1618 + 4) {
      local_1458 = local_15c0;
      local_1400 = *(undefined8 *)*local_15c0;
      uStack_13f8 = *(undefined8 *)(*local_15c0 + 8);
      local_1438 = local_15c0;
      local_620 = ZEXT816(0) << 0x20;
      local_630 = 0;
      local_610._8_8_ = SUB168(ZEXT816(0),4);
      uStack_628 = local_610._8_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_610._8_8_;
      local_1420 = vmaxps_avx(auVar27 << 0x40,*(undefined1 (*) [16])*local_15c0);
      local_5f0 = 0;
      uStack_5e8 = local_610._8_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_610._8_8_;
      auVar1 = vminps_avx(auVar28 << 0x40,*(undefined1 (*) [16])*local_15c0);
      local_1430._0_8_ = auVar1._0_8_;
      local_1430._8_8_ = auVar1._8_8_;
      local_590 = 0x3f8000003f800000;
      uStack_588 = 0x3f8000003f800000;
      local_4c0 = local_1430._0_8_;
      uStack_4b8 = local_1430._8_8_;
      local_4d0 = 0x42b0c0a542b0c0a5;
      uStack_4c8 = 0x42b0c0a542b0c0a5;
      auVar21._8_8_ = 0x42b0c0a542b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar21);
      local_550._0_8_ = auVar1._0_8_;
      local_4f0 = local_550._0_8_;
      local_550._8_8_ = auVar1._8_8_;
      uStack_4e8 = local_550._8_8_;
      local_500 = 0xc2b0c0a5c2b0c0a5;
      uStack_4f8 = 0xc2b0c0a5c2b0c0a5;
      auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar1,auVar20);
      local_550._0_8_ = auVar3._0_8_;
      uVar8 = local_550._0_8_;
      local_550._8_8_ = auVar3._8_8_;
      uVar9 = local_550._8_8_;
      local_3f0 = 0x3fb8aa3b3fb8aa3b;
      uStack_3e8 = 0x3fb8aa3b3fb8aa3b;
      local_3e0._0_4_ = auVar3._0_4_;
      local_3e0._4_4_ = auVar3._4_4_;
      uStack_3d8._0_4_ = auVar3._8_4_;
      uStack_3d8._4_4_ = auVar3._12_4_;
      local_570._4_4_ = local_3e0._4_4_ * 1.442695;
      local_570._0_4_ = (float)local_3e0 * 1.442695;
      uStack_568._0_4_ = (float)uStack_3d8 * 1.442695;
      uStack_568._4_4_ = uStack_3d8._4_4_ * 1.442695;
      local_460 = local_570;
      uStack_458 = uStack_568;
      local_470 = 0x3f0000003f000000;
      uStack_468 = 0x3f0000003f000000;
      local_570._0_4_ = (float)local_3e0 * 1.442695 + 0.5;
      local_570._4_4_ = local_3e0._4_4_ * 1.442695 + 0.5;
      fVar30 = (float)uStack_3d8 * 1.442695 + 0.5;
      fVar33 = uStack_3d8._4_4_ * 1.442695 + 0.5;
      uStack_568._0_4_ = fVar30;
      uStack_568._4_4_ = fVar33;
      local_3a0 = local_570;
      uStack_398 = uStack_568;
      local_580._4_4_ = (int)(float)local_570._4_4_;
      local_580._0_4_ = (int)(float)local_570._0_4_;
      local_580._8_4_ = (int)fVar30;
      local_580._12_4_ = (int)fVar33;
      local_390 = local_580._0_8_;
      uStack_388 = local_580._8_8_;
      auVar22._8_8_ = local_580._8_8_;
      auVar22._0_8_ = local_580._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar22);
      local_560 = auVar2._0_8_;
      local_370 = local_560;
      uStack_558 = auVar2._8_8_;
      uStack_368 = uStack_558;
      local_380 = local_570;
      uStack_378 = uStack_568;
      auVar23._8_8_ = uStack_568;
      auVar23._0_8_ = local_570;
      auVar1 = vcmpps_avx(auVar23,auVar2,1);
      local_5a0._0_8_ = auVar1._0_8_;
      local_350 = local_5a0._0_8_;
      local_5a0._8_8_ = auVar1._8_8_;
      uStack_348 = local_5a0._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar24._8_8_ = 0x3f8000003f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      local_5a0 = vpand_avx(auVar1,auVar24);
      local_4a0 = local_560;
      uStack_498 = uStack_558;
      local_4b0 = local_5a0._0_8_;
      uStack_4a8 = local_5a0._8_8_;
      _local_570 = vsubps_avx(auVar2,local_5a0);
      local_328 = local_570;
      local_2d0 = ::_ps_cephes_exp_C1;
      local_338 = local_550;
      local_2b0 = local_550._0_8_;
      uStack_2a8 = local_550._8_8_;
      local_2a0[0] = 0.6933594;
      local_2a0[1] = 0.6933594;
      afStack_298[0] = 0.6933594;
      afStack_298[1] = 0.6933594;
      local_290._0_4_ = local_570._0_4_;
      local_290._4_4_ = local_570._4_4_;
      uStack_288._0_4_ = local_570._8_4_;
      uStack_288._4_4_ = local_570._12_4_;
      local_2c0 = (float)local_290 * 0.6933594;
      fStack_2bc = local_290._4_4_ * 0.6933594;
      fStack_2b8 = (float)uStack_288 * 0.6933594;
      fStack_2b4 = uStack_288._4_4_ * 0.6933594;
      auVar26._4_4_ = fStack_2bc;
      auVar26._0_4_ = local_2c0;
      auVar26._8_4_ = fStack_2b8;
      auVar26._12_4_ = fStack_2b4;
      auVar1 = vsubps_avx(auVar3,auVar26);
      local_330 = ::_ps_cephes_exp_C2;
      local_550._0_8_ = auVar1._0_8_;
      local_310 = local_550._0_8_;
      local_550._8_8_ = auVar1._8_8_;
      uStack_308 = local_550._8_8_;
      local_2f0 = local_570;
      uStack_2e8 = uStack_568;
      local_300[0] = -0.00021219444;
      local_300[1] = -0.00021219444;
      afStack_2f8[0] = -0.00021219444;
      afStack_2f8[1] = -0.00021219444;
      local_320 = (float)local_290 * -0.00021219444;
      fStack_31c = local_290._4_4_ * -0.00021219444;
      fStack_318 = (float)uStack_288 * -0.00021219444;
      fStack_314 = uStack_288._4_4_ * -0.00021219444;
      auVar25._4_4_ = fStack_31c;
      auVar25._0_4_ = local_320;
      auVar25._8_4_ = fStack_318;
      auVar25._12_4_ = fStack_314;
      local_550 = vsubps_avx(auVar1,auVar25);
      local_410 = local_550._0_8_;
      uStack_408 = local_550._8_8_;
      local_400._0_4_ = local_550._0_4_;
      local_400._4_4_ = local_550._4_4_;
      uStack_3f8._0_4_ = local_550._8_4_;
      uStack_3f8._4_4_ = local_550._12_4_;
      local_560 = CONCAT44(local_400._4_4_ * local_400._4_4_,(float)local_400 * (float)local_400);
      uStack_558._0_4_ = (float)uStack_3f8 * (float)uStack_3f8;
      uStack_558._4_4_ = uStack_3f8._4_4_ * uStack_3f8._4_4_;
      local_268 = &local_5b0;
      local_98 = ::_ps_cephes_exp_p1;
      local_50 = 0x3950696739506967;
      uStack_48 = 0x3950696739506967;
      local_60 = local_550._0_8_;
      uStack_58 = local_550._8_8_;
      local_70 = (float)local_400 * 0.00019875691;
      fStack_6c = local_400._4_4_ * 0.00019875691;
      fStack_68 = (float)uStack_3f8 * 0.00019875691;
      fStack_64 = uStack_3f8._4_4_ * 0.00019875691;
      local_80[0] = 0.0013981999;
      local_80[1] = 0.0013981999;
      afStack_78[0] = 0.0013981999;
      afStack_78[1] = 0.0013981999;
      local_5b0 = CONCAT44(fStack_6c + 0.0013981999,local_70 + 0.0013981999);
      uStack_5a8 = CONCAT44(fStack_64 + 0.0013981999,fStack_68 + 0.0013981999);
      local_f8 = ::_ps_cephes_exp_p2;
      local_b0 = local_5b0;
      uStack_a8 = uStack_5a8;
      local_c0 = local_550._0_8_;
      uStack_b8 = local_550._8_8_;
      local_d0 = (local_70 + 0.0013981999) * (float)local_400;
      fStack_cc = (fStack_6c + 0.0013981999) * local_400._4_4_;
      fStack_c8 = (fStack_68 + 0.0013981999) * (float)uStack_3f8;
      fStack_c4 = (fStack_64 + 0.0013981999) * uStack_3f8._4_4_;
      local_e0[0] = 0.008333452;
      local_e0[1] = 0.008333452;
      afStack_d8[0] = 0.008333452;
      afStack_d8[1] = 0.008333452;
      local_5b0 = CONCAT44(fStack_cc + 0.008333452,local_d0 + 0.008333452);
      uStack_5a8 = CONCAT44(fStack_c4 + 0.008333452,fStack_c8 + 0.008333452);
      local_158 = ::_ps_cephes_exp_p3;
      local_110 = local_5b0;
      uStack_108 = uStack_5a8;
      local_120 = local_550._0_8_;
      uStack_118 = local_550._8_8_;
      local_130 = (local_d0 + 0.008333452) * (float)local_400;
      fStack_12c = (fStack_cc + 0.008333452) * local_400._4_4_;
      fStack_128 = (fStack_c8 + 0.008333452) * (float)uStack_3f8;
      fStack_124 = (fStack_c4 + 0.008333452) * uStack_3f8._4_4_;
      local_140[0] = 0.041665796;
      local_140[1] = 0.041665796;
      afStack_138[0] = 0.041665796;
      afStack_138[1] = 0.041665796;
      local_5b0 = CONCAT44(fStack_12c + 0.041665796,local_130 + 0.041665796);
      uStack_5a8 = CONCAT44(fStack_124 + 0.041665796,fStack_128 + 0.041665796);
      local_1b8 = ::_ps_cephes_exp_p4;
      local_170 = local_5b0;
      uStack_168 = uStack_5a8;
      local_180 = local_550._0_8_;
      uStack_178 = local_550._8_8_;
      local_190 = (local_130 + 0.041665796) * (float)local_400;
      fStack_18c = (fStack_12c + 0.041665796) * local_400._4_4_;
      fStack_188 = (fStack_128 + 0.041665796) * (float)uStack_3f8;
      fStack_184 = (fStack_124 + 0.041665796) * uStack_3f8._4_4_;
      local_1a0[0] = 0.16666666;
      local_1a0[1] = 0.16666666;
      afStack_198[0] = 0.16666666;
      afStack_198[1] = 0.16666666;
      local_5b0 = CONCAT44(fStack_18c + 0.16666666,local_190 + 0.16666666);
      uStack_5a8 = CONCAT44(fStack_184 + 0.16666666,fStack_188 + 0.16666666);
      local_218 = ::_ps_cephes_exp_p5;
      local_1d0 = local_5b0;
      uStack_1c8 = uStack_5a8;
      local_1e0 = local_550._0_8_;
      uStack_1d8 = local_550._8_8_;
      local_1f0 = (local_190 + 0.16666666) * (float)local_400;
      fStack_1ec = (fStack_18c + 0.16666666) * local_400._4_4_;
      fStack_1e8 = (fStack_188 + 0.16666666) * (float)uStack_3f8;
      fStack_1e4 = (fStack_184 + 0.16666666) * uStack_3f8._4_4_;
      local_200[0] = 0.5;
      local_200[1] = 0.5;
      afStack_1f8[0] = 0.5;
      afStack_1f8[1] = 0.5;
      local_5b0 = CONCAT44(fStack_1ec + 0.5,local_1f0 + 0.5);
      uStack_5a8 = CONCAT44(fStack_1e4 + 0.5,fStack_1e8 + 0.5);
      local_270 = &local_560;
      local_230 = local_5b0;
      uStack_228 = uStack_5a8;
      local_240 = local_560;
      uStack_238 = uStack_558;
      local_250 = (local_1f0 + 0.5) * (float)local_400 * (float)local_400;
      fStack_24c = (fStack_1ec + 0.5) * local_400._4_4_ * local_400._4_4_;
      fStack_248 = (fStack_1e8 + 0.5) * (float)uStack_3f8 * (float)uStack_3f8;
      fStack_244 = (fStack_1e4 + 0.5) * uStack_3f8._4_4_ * uStack_3f8._4_4_;
      local_260 = local_550._0_8_;
      uStack_258 = local_550._8_8_;
      local_5b0 = CONCAT44(fStack_24c + local_400._4_4_,local_250 + (float)local_400);
      uStack_5a8 = CONCAT44(fStack_244 + uStack_3f8._4_4_,fStack_248 + (float)uStack_3f8);
      local_480 = local_5b0;
      uStack_478 = uStack_5a8;
      local_490 = 0x3f8000003f800000;
      uStack_488 = 0x3f8000003f800000;
      fVar30 = local_250 + (float)local_400 + 1.0;
      fVar33 = fStack_24c + local_400._4_4_ + 1.0;
      fVar34 = fStack_248 + (float)uStack_3f8 + 1.0;
      fVar35 = fStack_244 + uStack_3f8._4_4_ + 1.0;
      local_5b0 = CONCAT44(fVar33,fVar30);
      uStack_5a8 = CONCAT44(fVar35,fVar34);
      local_3b0 = local_570;
      uStack_3a8 = uStack_568;
      local_580._4_4_ = (int)local_290._4_4_;
      local_580._0_4_ = (int)(float)local_290;
      local_580._8_4_ = (int)(float)uStack_288;
      local_580._12_4_ = (int)uStack_288._4_4_;
      local_530 = local_580._0_8_;
      uStack_528 = local_580._8_8_;
      local_540 = 0x7f0000007f;
      uStack_538 = 0x7f0000007f;
      auVar19._8_8_ = local_580._8_8_;
      auVar19._0_8_ = local_580._0_8_;
      auVar18._8_8_ = 0x7f0000007f;
      auVar18._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar19,auVar18);
      local_580._0_8_ = auVar1._0_8_;
      local_510 = local_580._0_8_;
      local_580._8_8_ = auVar1._8_8_;
      uStack_508 = local_580._8_8_;
      local_514 = 0x17;
      local_580 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_40 = local_580._0_8_;
      uStack_38 = local_580._8_8_;
      local_5c0 = local_580._0_8_;
      uStack_5b8 = local_580._8_8_;
      local_420 = local_5b0;
      uStack_418 = uStack_5a8;
      local_430._0_4_ = local_580._0_4_;
      local_430._4_4_ = local_580._4_4_;
      uStack_428._0_4_ = local_580._8_4_;
      uStack_428._4_4_ = local_580._12_4_;
      local_5b0 = CONCAT44(fVar33 * local_430._4_4_,fVar30 * (float)local_430);
      uStack_5a8 = CONCAT44(fVar35 * uStack_428._4_4_,fVar34 * (float)uStack_428);
      local_5d0 = local_5b0;
      uStack_5c8 = uStack_5a8;
      local_13d4 = 0x3f800000;
      local_13f0 = 0x3f800000;
      local_5e0 = 0x3f8000003f800000;
      uStack_5d8 = 0x3f8000003f800000;
      auVar2._8_8_ = uStack_5a8;
      auVar2._0_8_ = local_5b0;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      local_1430 = vsubps_avx(auVar2,auVar1);
      local_3d0._0_4_ = local_1430._0_4_;
      local_3d0._4_4_ = local_1430._4_4_;
      uStack_3c8._0_4_ = local_1430._8_4_;
      uStack_3c8._4_4_ = local_1430._12_4_;
      local_450 = local_1470 * (float)local_3d0;
      fStack_44c = local_1470 * local_3d0._4_4_;
      fStack_448 = local_1470 * (float)uStack_3c8;
      fStack_444 = local_1470 * uStack_3c8._4_4_;
      local_440._0_4_ = local_1420._0_4_;
      local_440._4_4_ = local_1420._4_4_;
      fStack_438 = local_1420._8_4_;
      fStack_434 = local_1420._12_4_;
      local_1450 = (float)local_440._0_4_ + local_450;
      fStack_144c = (float)local_440._4_4_ + fStack_44c;
      fStack_1448 = fStack_438 + fStack_448;
      fStack_1444 = fStack_434 + fStack_444;
      *(ulong *)*local_15c0 = CONCAT44(fStack_144c,local_1450);
      *(ulong *)(*local_15c0 + 8) = CONCAT44(fStack_1444,fStack_1448);
      local_15c0 = (undefined1 (*) [32])(*local_15c0 + 0x10);
      local_1410 = CONCAT44(local_1470,local_1470);
      uStack_1408 = CONCAT44(local_1470,local_1470);
      uStack_13ec = local_13f0;
      uStack_13e8 = local_13f0;
      uStack_13e4 = local_13f0;
      local_640 = local_1400;
      uStack_638 = uStack_13f8;
      local_610 = local_620;
      local_600 = local_1400;
      uStack_5f8 = uStack_13f8;
      local_4e0 = local_620;
      _local_440 = local_1420;
      local_430 = local_580._0_8_;
      uStack_428 = local_580._8_8_;
      local_400 = local_410;
      uStack_3f8 = uStack_408;
      local_3e0 = uVar8;
      uStack_3d8 = uVar9;
      local_3d0 = local_1430._0_8_;
      uStack_3c8 = local_1430._8_8_;
      local_3c0 = CONCAT44(local_1470,local_1470);
      uStack_3b8 = CONCAT44(local_1470,local_1470);
      local_2d8 = local_338;
      local_2c8 = local_328;
      local_290 = local_570;
      uStack_288 = uStack_568;
      local_278 = local_338;
      local_210 = local_338;
      local_208 = local_268;
      local_1b0 = local_338;
      local_1a8 = local_268;
      local_150 = local_338;
      local_148 = local_268;
      local_f0 = local_338;
      local_e8 = local_268;
      local_90 = local_338;
      local_88 = local_268;
    }
    for (; local_1618 < local_15b4; local_1618 = local_1618 + 1) {
      if (*(float *)*local_15c0 < 0.0) {
        fVar30 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        fVar33 = expf(*(float *)*local_15c0);
        *(float *)*local_15c0 = fVar30 * (fVar33 - 1.0);
      }
      local_15c0 = (undefined1 (*) [32])(*local_15c0 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}